

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O1

bool __thiscall
glcts::ShaderBitfieldOperationCaseLdexp::test(ShaderBitfieldOperationCaseLdexp *this,Data *data)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  float fVar5;
  
  bVar2 = this->m_components < 1;
  if (0 < this->m_components) {
    fVar5 = ldexpf(data->inVec4[0],data->inIvec4[0]);
    fVar5 = fVar5 - data->outVec4[0];
    uVar4 = -(uint)(-fVar5 <= fVar5);
    if ((float)(~uVar4 & (uint)-fVar5 | (uint)fVar5 & uVar4) <= 0.0001) {
      lVar3 = 0;
      do {
        lVar1 = lVar3 + 1;
        bVar2 = this->m_components <= lVar1;
        if (this->m_components <= lVar1) {
          return bVar2;
        }
        fVar5 = ldexpf(data->inVec4[lVar3 + 1],data->inIvec4[lVar3 + 1]);
        fVar5 = fVar5 - data->outVec4[lVar3 + 1];
        uVar4 = -(uint)(-fVar5 <= fVar5);
        lVar3 = lVar1;
      } while ((float)(~uVar4 & (uint)-fVar5 | (uint)fVar5 & uVar4) <= 0.0001);
    }
  }
  return bVar2;
}

Assistant:

virtual bool test(Data const* data)
	{
		for (int i = 0; i < m_components; ++i)
		{
			float expected = deFloatLdExp(data->inVec4[i], data->inIvec4[i]);
			if (deFloatAbs(expected - data->outVec4[i]) > 0.0001f)
			{
				return false;
			}
		}
		return true;
	}